

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBeginException(WatWriter *this,Exception *except)

{
  string_view str;
  NextChar in_R8D;
  
  WritePuts(this,"(",None);
  WritePuts(this,"except",Space);
  this->indent_ = this->indent_ + 2;
  str.data_ = (except->name)._M_dataplus._M_p;
  str.size_ = (except->name)._M_string_length;
  WriteNameOrIndex(this,str,this->except_index_,in_R8D);
  WriteInlineExports(this,Except,this->except_index_);
  WriteInlineImport(this,Except,this->except_index_);
  WriteTypes(this,&except->sig,(char *)0x0);
  this->except_index_ = this->except_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginException(const Exception& except) {
  WriteOpenSpace("except");
  WriteNameOrIndex(except.name, except_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Except, except_index_);
  WriteInlineImport(ExternalKind::Except, except_index_);
  WriteTypes(except.sig, nullptr);
  ++except_index_;
}